

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall
QList<QDockAreaLayoutItem>::move(QList<QDockAreaLayoutItem> *this,qsizetype from,qsizetype to)

{
  long in_RDX;
  long in_RSI;
  QDockAreaLayoutItem *in_RDI;
  QDockAreaLayoutItem *unaff_retaddr;
  QDockAreaLayoutItem *b;
  QDockAreaLayoutItem *__last;
  
  if (in_RSI != in_RDX) {
    __last = in_RDI;
    detach((QList<QDockAreaLayoutItem> *)0x57e83a);
    QArrayDataPointer<QDockAreaLayoutItem>::operator->
              ((QArrayDataPointer<QDockAreaLayoutItem> *)in_RDI);
    QArrayDataPointer<QDockAreaLayoutItem>::begin
              ((QArrayDataPointer<QDockAreaLayoutItem> *)0x57e84b);
    if (in_RSI < in_RDX) {
      std::_V2::rotate<QDockAreaLayoutItem*>(b,unaff_retaddr,__last);
    }
    else {
      std::_V2::rotate<QDockAreaLayoutItem*>(b,unaff_retaddr,__last);
    }
  }
  return;
}

Assistant:

void move(qsizetype from, qsizetype to)
    {
        Q_ASSERT_X(from >= 0 && from < size(), "QList::move(qsizetype, qsizetype)", "'from' is out-of-range");
        Q_ASSERT_X(to >= 0 && to < size(), "QList::move(qsizetype, qsizetype)", "'to' is out-of-range");
        if (from == to) // don't detach when no-op
            return;
        detach();
        T * const b = d->begin();
        if (from < to)
            std::rotate(b + from, b + from + 1, b + to + 1);
        else
            std::rotate(b + to, b + from, b + from + 1);
    }